

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sighashtype.cpp
# Opt level: O2

void __thiscall
SigHashType_CheckFlag_Test::~SigHashType_CheckFlag_Test(SigHashType_CheckFlag_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(SigHashType, CheckFlag) {
  SigHashType sighash = SigHashType(SigHashAlgorithm::kSigHashUnknown);
  EXPECT_FALSE(sighash.IsValid());

  sighash = SigHashType(SigHashAlgorithm::kSigHashAll);
  sighash.SetRangeproof(true);
  EXPECT_FALSE(sighash.IsAnyoneCanPay());
  EXPECT_TRUE(sighash.IsRangeproof());
  sighash.SetAnyoneCanPay(true);
  EXPECT_TRUE(sighash.IsAnyoneCanPay());
  EXPECT_TRUE(sighash.IsRangeproof());
}